

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTool.hpp
# Opt level: O3

void __thiscall
helptool::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  pointer pcVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The execution time about ",0x19);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->content_)._M_dataplus._M_p,
                      (this->content_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is: ",5);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->m_unit_)._M_dataplus._M_p,(this->m_unit_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pcVar1 = (this->content_)._M_dataplus._M_p;
  paVar3 = &(this->content_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_unit_)._M_dataplus._M_p;
  paVar3 = &(this->m_unit_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Timer()
    {
        auto duration = std::chrono::duration_cast<T>(std::chrono::high_resolution_clock::now()-m_t_);
        PRINTN("The execution time about "<<  content_ <<" is: " << duration.count()/times_ << " " << m_unit_);
    }